

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-tests.cpp
# Opt level: O0

void __thiscall ComplexClass::ComplexClass(ComplexClass *this)

{
  SimpleStruct *pSVar1;
  SimpleClass *this_00;
  ClassWithMemAllocations *this_01;
  LibClass *this_02;
  ComplexClass *this_local;
  
  pSVar1 = (SimpleStruct *)operator_new__(0x50);
  this->m_MemberArr1 = pSVar1;
  this_00 = (SimpleClass *)operator_new(8);
  SimpleClass::SimpleClass(this_00);
  this->m_MemberPtr2 = this_00;
  this_01 = (ClassWithMemAllocations *)operator_new(0x18);
  ClassWithMemAllocations::ClassWithMemAllocations(this_01);
  this->m_MemberPtr3 = this_01;
  this_02 = (LibClass *)operator_new(0x50);
  LibClass::LibClass(this_02);
  this->m_MemberPtr4 = this_02;
  return;
}

Assistant:

ComplexClass() {
        m_MemberArr1 = new SimpleStruct[10];
        m_MemberPtr2 = new SimpleClass();
        m_MemberPtr3 = new ClassWithMemAllocations();
        m_MemberPtr4 = new LibClass();
    }